

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_interface.cc
# Opt level: O2

TrainerInterface * __thiscall
sentencepiece::TrainerInterface::InitMetaPieces(TrainerInterface *this)

{
  TrainerSpec *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  string *psVar3;
  long in_RSI;
  int iVar4;
  long lVar5;
  long lVar6;
  bool has_unk;
  anon_class_16_2_878a7968 insert_id;
  int id;
  anon_class_24_3_df37360f insert_meta_symbol;
  string local_1d0 [32];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dup;
  
  if (*(long *)(in_RSI + 0x288) == 0) {
    insert_id.has_unk = &has_unk;
    has_unk = false;
    this_00 = (TrainerSpec *)(in_RSI + 0x70);
    iVar4 = *(int *)(in_RSI + 0x174);
    psVar3 = TrainerSpec::unk_piece_abi_cxx11_(this_00);
    bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&insert_id,iVar4,psVar3);
    if (bVar2) {
      iVar4 = *(int *)(in_RSI + 0x1b4);
      psVar3 = TrainerSpec::bos_piece_abi_cxx11_(this_00);
      bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&insert_id,iVar4,psVar3);
      if (bVar2) {
        iVar4 = *(int *)(in_RSI + 0x1b8);
        psVar3 = TrainerSpec::eos_piece_abi_cxx11_(this_00);
        bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&insert_id,iVar4,psVar3);
        if (bVar2) {
          iVar4 = *(int *)(in_RSI + 0x1bc);
          psVar3 = TrainerSpec::pad_piece_abi_cxx11_(this_00);
          bVar2 = InitMetaPieces::anon_class_16_2_878a7968::operator()(&insert_id,iVar4,psVar3);
          if (bVar2) {
            if (has_unk != false) {
              dup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &dup._M_t._M_impl.super__Rb_tree_header._M_header;
              dup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              dup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              dup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              insert_meta_symbol.id = &id;
              id = 0;
              insert_meta_symbol.dup = &dup;
              lVar5 = *(long *)(in_RSI + 0xe8) + 8;
              if (*(long *)(in_RSI + 0xe8) == 0) {
                lVar5 = 0;
              }
              iVar4 = *(int *)(in_RSI + 0xe0);
              dup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   dup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              for (lVar6 = 0; (long)iVar4 * 8 != lVar6; lVar6 = lVar6 + 8) {
                InitMetaPieces::anon_class_24_3_df37360f::operator()
                          ((anon_class_24_3_df37360f *)this,(string *)&insert_meta_symbol,
                           (Type)*(undefined8 *)(lVar5 + lVar6));
                if (this->_vptr_TrainerInterface != (_func_int **)0x0) goto LAB_0016ea38;
                sentencepiece::util::Status::~Status((Status *)this);
              }
              lVar5 = *(long *)(in_RSI + 0x100) + 8;
              if (*(long *)(in_RSI + 0x100) == 0) {
                lVar5 = 0;
              }
              iVar4 = *(int *)(in_RSI + 0xf8);
              for (lVar6 = 0; (long)iVar4 * 8 != lVar6; lVar6 = lVar6 + 8) {
                InitMetaPieces::anon_class_24_3_df37360f::operator()
                          ((anon_class_24_3_df37360f *)this,(string *)&insert_meta_symbol,
                           (Type)*(undefined8 *)(lVar5 + lVar6));
                if (this->_vptr_TrainerInterface != (_func_int **)0x0) goto LAB_0016ea38;
                sentencepiece::util::Status::~Status((Status *)this);
              }
              if (*(char *)(in_RSI + 0x170) == '\x01') {
                for (iVar4 = 0; iVar4 != 0x100; iVar4 = iVar4 + 1) {
                  sentencepiece::ByteToPiece_abi_cxx11_((uchar)local_1d0);
                  InitMetaPieces::anon_class_24_3_df37360f::operator()
                            ((anon_class_24_3_df37360f *)this,(string *)&insert_meta_symbol,
                             (Type)local_1d0);
                  std::__cxx11::string::~string(local_1d0);
                  if (this->_vptr_TrainerInterface != (_func_int **)0x0) goto LAB_0016ea38;
                  sentencepiece::util::Status::~Status((Status *)this);
                }
              }
              sentencepiece::util::Status::Status((Status *)this);
LAB_0016ea38:
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&dup._M_t);
              return this;
            }
            p_Var1 = &dup._M_t._M_impl.super__Rb_tree_header;
            dup._M_t._M_impl._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
            std::operator<<((ostream *)p_Var1,"src/trainer_interface.cc");
            std::operator<<((ostream *)p_Var1,"(");
            std::ostream::operator<<(p_Var1,0x2f8);
            std::operator<<((ostream *)p_Var1,") [");
            std::operator<<((ostream *)p_Var1,"has_unk");
            std::operator<<((ostream *)p_Var1,"] ");
            psVar3 = TrainerSpec::unk_piece_abi_cxx11_(this_00);
            std::operator<<((ostream *)p_Var1,(string *)psVar3);
            std::operator<<((ostream *)p_Var1," must be defined.");
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
          }
          else {
            p_Var1 = &dup._M_t._M_impl.super__Rb_tree_header;
            dup._M_t._M_impl._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
            std::operator<<((ostream *)p_Var1,"src/trainer_interface.cc");
            std::operator<<((ostream *)p_Var1,"(");
            std::ostream::operator<<(p_Var1,0x2f6);
            std::operator<<((ostream *)p_Var1,") [");
            std::operator<<((ostream *)p_Var1,
                            "insert_id(trainer_spec_.pad_id(), trainer_spec_.pad_piece())");
            std::operator<<((ostream *)p_Var1,"] ");
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
          }
        }
        else {
          p_Var1 = &dup._M_t._M_impl.super__Rb_tree_header;
          dup._M_t._M_impl._0_4_ = 0xd;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
          std::operator<<((ostream *)p_Var1,"src/trainer_interface.cc");
          std::operator<<((ostream *)p_Var1,"(");
          std::ostream::operator<<(p_Var1,0x2f5);
          std::operator<<((ostream *)p_Var1,") [");
          std::operator<<((ostream *)p_Var1,
                          "insert_id(trainer_spec_.eos_id(), trainer_spec_.eos_piece())");
          std::operator<<((ostream *)p_Var1,"] ");
          util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
        }
      }
      else {
        p_Var1 = &dup._M_t._M_impl.super__Rb_tree_header;
        dup._M_t._M_impl._0_4_ = 0xd;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
        std::operator<<((ostream *)p_Var1,"src/trainer_interface.cc");
        std::operator<<((ostream *)p_Var1,"(");
        std::ostream::operator<<(p_Var1,0x2f4);
        std::operator<<((ostream *)p_Var1,") [");
        std::operator<<((ostream *)p_Var1,
                        "insert_id(trainer_spec_.bos_id(), trainer_spec_.bos_piece())");
        std::operator<<((ostream *)p_Var1,"] ");
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      }
    }
    else {
      p_Var1 = &dup._M_t._M_impl.super__Rb_tree_header;
      dup._M_t._M_impl._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
      std::operator<<((ostream *)p_Var1,"src/trainer_interface.cc");
      std::operator<<((ostream *)p_Var1,"(");
      std::ostream::operator<<(p_Var1,0x2f3);
      std::operator<<((ostream *)p_Var1,") [");
      std::operator<<((ostream *)p_Var1,
                      "insert_id(trainer_spec_.unk_id(), trainer_spec_.unk_piece())");
      std::operator<<((ostream *)p_Var1,"] ");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    }
  }
  else {
    p_Var1 = &dup._M_t._M_impl.super__Rb_tree_header;
    dup._M_t._M_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)p_Var1);
    std::operator<<((ostream *)p_Var1,"src/trainer_interface.cc");
    std::operator<<((ostream *)p_Var1,"(");
    std::ostream::operator<<(p_Var1,0x2e3);
    std::operator<<((ostream *)p_Var1,") [");
    std::operator<<((ostream *)p_Var1,"meta_pieces_.empty()");
    std::operator<<((ostream *)p_Var1,"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&dup._M_t._M_impl.super__Rb_tree_header);
  return this;
}

Assistant:

util::Status TrainerInterface::InitMetaPieces() {
  CHECK_OR_RETURN(meta_pieces_.empty());
  bool has_unk = false;

  auto insert_id = [&has_unk, this](int id, const std::string &w) -> bool {
    if (id < 0) return true;
    if (id >= trainer_spec_.vocab_size() ||
        meta_pieces_.find(id) != meta_pieces_.end() ||
        (has_unk && w == trainer_spec_.unk_piece()))
      return false;
    if (w == trainer_spec_.unk_piece()) has_unk = true;
    meta_pieces_[id] = std::make_pair(
        w, w == trainer_spec_.unk_piece() ? ModelProto::SentencePiece::UNKNOWN
                                          : ModelProto::SentencePiece::CONTROL);
    return true;
  };

  CHECK_OR_RETURN(insert_id(trainer_spec_.unk_id(), trainer_spec_.unk_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.bos_id(), trainer_spec_.bos_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.eos_id(), trainer_spec_.eos_piece()));
  CHECK_OR_RETURN(insert_id(trainer_spec_.pad_id(), trainer_spec_.pad_piece()));

  CHECK_OR_RETURN(has_unk) << trainer_spec_.unk_piece() << " must be defined.";

  std::set<std::string> dup;

  int id = 0;
  auto insert_meta_symbol =
      [&id, &dup, this](const std::string &w,
                        ModelProto::SentencePiece::Type type) -> util::Status {
    if (!dup.insert(w).second) {
      return util::InternalError(absl::StrCat(
          w, " is already defined. duplicated symbols are not allowed."));
    }

    if (w == trainer_spec_.unk_piece()) {
      return util::InternalError(
          absl::StrCat(trainer_spec_.unk_piece(),
                       " must not be defined with --control_symbols and "
                       "--user_defined_symbols."));
    }

    if (w == trainer_spec_.bos_piece() && trainer_spec_.bos_id() >= 0) {
      meta_pieces_[trainer_spec_.bos_id()].second = type;
    } else if (w == trainer_spec_.eos_piece() && trainer_spec_.eos_id() >= 0) {
      meta_pieces_[trainer_spec_.eos_id()].second = type;
    } else if (w == trainer_spec_.pad_piece() && trainer_spec_.pad_id() >= 0) {
      meta_pieces_[trainer_spec_.pad_id()].second = type;
    } else {
      while (meta_pieces_.find(id) != meta_pieces_.end()) ++id;
      meta_pieces_[id] = std::make_pair(w, type);
    }

    return util::OkStatus();
  };

  for (const auto &w : trainer_spec_.control_symbols()) {
    RETURN_IF_ERROR(insert_meta_symbol(w, ModelProto::SentencePiece::CONTROL));
  }

  for (const auto &w : trainer_spec_.user_defined_symbols()) {
    RETURN_IF_ERROR(
        insert_meta_symbol(w, ModelProto::SentencePiece::USER_DEFINED));
  }

  if (trainer_spec_.byte_fallback()) {
    for (int i = 0; i < 256; ++i) {
      RETURN_IF_ERROR(
          insert_meta_symbol(ByteToPiece(i), ModelProto::SentencePiece::BYTE));
    }
  }

  return util::OkStatus();
}